

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointElement.cpp
# Opt level: O2

bool __thiscall
iDynTree::JointElement::setAttributes
          (JointElement *this,
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>_>_>
          *attributes)

{
  string *__lhs;
  bool bVar1;
  const_iterator cVar2;
  bool bVar3;
  string errStr;
  key_type local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"name",(allocator<char> *)&local_80);
  cVar2 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)attributes,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  if (cVar2.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>,_true>
      ._M_cur != (__node_type *)0x0) {
    iDynTree::XMLAttribute::value_abi_cxx11_();
    std::__cxx11::string::operator=((string *)&this->m_jointName,(string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"type",(allocator<char> *)&local_80);
  cVar2 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)attributes,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  bVar3 = true;
  if (cVar2.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>,_true>
      ._M_cur != (__node_type *)0x0) {
    iDynTree::XMLAttribute::value_abi_cxx11_();
    __lhs = &this->m_jointType;
    std::__cxx11::string::operator=((string *)__lhs,(string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    bVar1 = std::operator!=(__lhs,"fixed");
    if (bVar1) {
      bVar1 = std::operator!=(__lhs,"revolute");
      if (bVar1) {
        bVar1 = std::operator!=(__lhs,"continuous");
        if (bVar1) {
          bVar1 = std::operator!=(__lhs,"prismatic");
          if (bVar1) {
            std::operator+(&local_40,"Joint ",&this->m_jointName);
            std::operator+(&local_60,&local_40," has type ");
            std::operator+(&local_80,&local_60,__lhs);
            std::operator+(&local_a0,&local_80," that is not currently supported by iDynTree.");
            std::__cxx11::string::~string((string *)&local_80);
            std::__cxx11::string::~string((string *)&local_60);
            std::__cxx11::string::~string((string *)&local_40);
            iDynTree::reportError("JointElement","setAttributes",local_a0._M_dataplus._M_p);
            std::__cxx11::string::~string((string *)&local_a0);
            bVar3 = false;
          }
        }
      }
    }
  }
  return bVar3;
}

Assistant:

bool JointElement::setAttributes(const std::unordered_map<std::string, std::shared_ptr<XMLAttribute>>& attributes) {
        // attributes: name
        auto found = attributes.find("name");
        if (found != attributes.end()) {
            m_jointName = found->second->value();
        }
        found = attributes.find("type");
        if (found != attributes.end()) {
            m_jointType = found->second->value();
            // Explicitly check the supported types
            if (m_jointType != "fixed"
                && m_jointType != "revolute"
                && m_jointType != "continuous"
                && m_jointType != "prismatic")
            {
                std::string errStr = "Joint " + m_jointName + " has type " + m_jointType + " that is not currently supported by iDynTree.";
                reportError("JointElement", "setAttributes", errStr.c_str());
                return false;
            }
        }
        return true;
    }